

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O3

vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_> *
__thiscall
iDynTree::optimalcontrol::OptimalControlProblem::getCostsTimeRanges(OptimalControlProblem *this)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  size_type __new_size;
  pointer pTVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  OptimalControlProblemPimpl *pOVar6;
  long lVar7;
  
  pOVar6 = this->m_pimpl;
  __new_size = (pOVar6->costs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (((long)(pOVar6->costTimeRanges).
             super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(pOVar6->costTimeRanges).
             super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size != 0
     ) {
    std::
    vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
    ::resize(&pOVar6->costTimeRanges,__new_size);
    pOVar6 = this->m_pimpl;
  }
  p_Var5 = (pOVar6->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(pOVar6->costs)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    lVar7 = 0;
    do {
      pTVar3 = (this->m_pimpl->costTimeRanges).
               super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (&pTVar3->m_anyTime)[lVar7] = SUB41(p_Var5[9]._M_color,0);
      p_Var4 = p_Var5[8]._M_right;
      puVar2 = (undefined8 *)((long)&pTVar3->m_initTime + lVar7);
      *puVar2 = p_Var5[8]._M_left;
      puVar2[1] = p_Var4;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      lVar7 = lVar7 + 0x18;
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    pOVar6 = this->m_pimpl;
  }
  return &pOVar6->costTimeRanges;
}

Assistant:

std::vector<TimeRange> &OptimalControlProblem::getCostsTimeRanges() const
        {
            if (m_pimpl->costTimeRanges.size() != m_pimpl->costs.size()) {
                m_pimpl->costTimeRanges.resize(m_pimpl->costs.size());
            }

            size_t i = 0;
            for (auto& c : m_pimpl->costs){
                m_pimpl->costTimeRanges[i] = c.second.timeRange;
                ++i;
            }
            return m_pimpl->costTimeRanges;
        }